

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.h
# Opt level: O2

uint32_t __thiscall re2c::Enc::nCodePoints(Enc *this)

{
  uint32_t uVar1;
  
  uVar1 = 0x110000;
  if ((ulong)this->type_ < 3) {
    uVar1 = *(uint32_t *)(&DAT_00151230 + (ulong)this->type_ * 4);
  }
  return uVar1;
}

Assistant:

inline uint32_t Enc::nCodePoints() const
{
	switch (type_)
	{
		case ASCII:
		case EBCDIC:	return 0x100;
		case UCS2:	return 0x10000;
		case UTF16:
		case UTF32:
		case UTF8:
		default:	return 0x110000;
	}
}